

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O0

void * push_ds_field(flatcc_builder_t *B,flatbuffers_uoffset_t size,uint16_t align,
                    flatbuffers_voffset_t id)

{
  flatbuffers_uoffset_t fVar1;
  int iVar2;
  flatbuffers_uoffset_t offset;
  flatbuffers_voffset_t id_local;
  uint16_t align_local;
  flatbuffers_uoffset_t size_local;
  flatcc_builder_t *B_local;
  
  fVar1 = alignup_uoffset(B->ds_offset,(ulong)align);
  B->ds_offset = fVar1 + size;
  if ((fVar1 + size < B->ds_limit) ||
     (iVar2 = reserve_ds(B,(ulong)(B->ds_offset + 1),0xfffc), iVar2 == 0)) {
    B->vs[id] = (short)fVar1 + 4;
    if (B->id_end <= id) {
      B->id_end = id + 1;
    }
    B_local = (flatcc_builder_t *)(B->ds + fVar1);
  }
  else {
    B_local = (flatcc_builder_t *)0x0;
  }
  return B_local;
}

Assistant:

static inline void *push_ds_field(flatcc_builder_t *B, uoffset_t size, uint16_t align, voffset_t id)
{
    uoffset_t offset;

    /*
     * We calculate table field alignment relative to first entry, not
     * header field with vtable offset.
     *
     * Note: >= comparison handles special case where B->ds is not
     * allocated yet and size is 0 so the return value would be mistaken
     * for an error.
     */
    offset = alignup_uoffset(B->ds_offset, align);
    if ((B->ds_offset = offset + size) >= B->ds_limit) {
        if (reserve_ds(B, B->ds_offset + 1, table_limit)) {
            return 0;
        }
    }
    B->vs[id] = (voffset_t)(offset + field_size);
    if (id >= B->id_end) {
        B->id_end = id + 1u;
    }
    return B->ds + offset;
}